

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugmodes.c
# Opt level: O2

void av1_print_frame_contexts(FRAME_CONTEXT *fc,char *filename)

{
  FILE *__stream;
  long lVar1;
  
  __stream = fopen64(filename,"w");
  for (lVar1 = 0; (int)lVar1 != 0x297e; lVar1 = lVar1 + 1) {
    fprintf(__stream,"%d ",(ulong)fc->txb_skip_cdf[0][0][lVar1]);
  }
  fclose(__stream);
  return;
}

Assistant:

void av1_print_frame_contexts(const FRAME_CONTEXT *fc, const char *filename) {
  FILE *fcFile = fopen(filename, "w");
  const uint16_t *fcp = (uint16_t *)fc;
  const unsigned int n_contexts = sizeof(FRAME_CONTEXT) / sizeof(uint16_t);
  unsigned int i;

  for (i = 0; i < n_contexts; ++i) fprintf(fcFile, "%d ", *fcp++);
  fclose(fcFile);
}